

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<void_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&),_void_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>
::call(cni_helper<void_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&),_void_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  vector *in_RDX;
  string sStack_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    cni_helper<void(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
    ::_call<0,1>((cni_helper<void(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
                  *)args,in_RDX,(sequence<0,_1> *)&cov::make_sequence<0,0,1>::result);
    any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_98,2);
  std::operator+(&local_78,"Wrong size of the arguments. Expected ",&local_98);
  std::operator+(&local_58,&local_78,", provided ");
  std::__cxx11::to_string
            (&sStack_b8,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_38,&local_58,&sStack_b8);
  cs::runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result);
			return cs::null_pointer;
		}